

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

void move_deviceOrModule_members_to_module
               (IOTHUB_DEVICE_OR_MODULE *deviceOrModule,IOTHUB_MODULE *module)

{
  char *pcVar1;
  
  if ((deviceOrModule != (IOTHUB_DEVICE_OR_MODULE *)0x0) && (0 < module->version)) {
    pcVar1 = deviceOrModule->primaryKey;
    module->deviceId = deviceOrModule->deviceId;
    module->primaryKey = pcVar1;
    pcVar1 = deviceOrModule->generationId;
    module->secondaryKey = deviceOrModule->secondaryKey;
    module->generationId = pcVar1;
    module->eTag = deviceOrModule->eTag;
    module->connectionState = deviceOrModule->connectionState;
    module->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
    module->status = deviceOrModule->status;
    pcVar1 = deviceOrModule->statusUpdatedTime;
    module->statusReason = deviceOrModule->statusReason;
    module->statusUpdatedTime = pcVar1;
    module->lastActivityTime = deviceOrModule->lastActivityTime;
    module->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
    module->isManaged = deviceOrModule->isManaged;
    pcVar1 = deviceOrModule->deviceProperties;
    module->configuration = deviceOrModule->configuration;
    module->deviceProperties = pcVar1;
    module->serviceProperties = deviceOrModule->serviceProperties;
    module->authMethod = deviceOrModule->authMethod;
    pcVar1 = deviceOrModule->managedBy;
    module->moduleId = deviceOrModule->moduleId;
    module->managedBy = pcVar1;
  }
  return;
}

Assistant:

static void move_deviceOrModule_members_to_module(IOTHUB_DEVICE_OR_MODULE* deviceOrModule, IOTHUB_MODULE* module)
{
    if ((deviceOrModule != NULL) && (module != NULL))
    {
        if (module->version >= IOTHUB_MODULE_VERSION_1)
        {
            module->deviceId = deviceOrModule->deviceId;
            module->primaryKey = deviceOrModule->primaryKey;
            module->secondaryKey = deviceOrModule->secondaryKey;
            module->generationId = deviceOrModule->generationId;
            module->eTag = deviceOrModule->eTag;
            module->connectionState = deviceOrModule->connectionState;
            module->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
            module->status = deviceOrModule->status;
            module->statusReason = deviceOrModule->statusReason;
            module->statusUpdatedTime = deviceOrModule->statusUpdatedTime;
            module->lastActivityTime = deviceOrModule->lastActivityTime;
            module->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
            module->isManaged = deviceOrModule->isManaged;
            module->configuration = deviceOrModule->configuration;
            module->deviceProperties = deviceOrModule->deviceProperties;
            module->serviceProperties = deviceOrModule->serviceProperties;
            module->authMethod = deviceOrModule->authMethod;
            module->moduleId = deviceOrModule->moduleId;
            module->managedBy = deviceOrModule->managedBy;
        }
    }
}